

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O2

void __thiscall
el::base::TypedConfigurations::setValue<unsigned_long>
          (TypedConfigurations *this,Level level,unsigned_long *value,
          map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
          *confMap,bool includeGlobalLevel)

{
  _Rb_tree_header *p_Var1;
  mapped_type_conflict1 mVar2;
  iterator iVar3;
  mapped_type_conflict1 *pmVar4;
  Level local_2c;
  pair<el::Level,_unsigned_long> local_28;
  
  local_2c = level;
  if ((confMap->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0 && includeGlobalLevel) {
    local_28.second = *value;
    local_28.first = Global;
  }
  else {
    local_28.first = Global;
    iVar3 = utils::std::
            _Rb_tree<el::Level,_std::pair<const_el::Level,_unsigned_long>,_std::_Select1st<std::pair<const_el::Level,_unsigned_long>_>,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
            ::find(&confMap->_M_t,&local_28.first);
    p_Var1 = &(confMap->_M_t)._M_impl.super__Rb_tree_header;
    if (((_Rb_tree_header *)iVar3._M_node != p_Var1) &&
       (iVar3._M_node[1]._M_parent == (_Base_ptr)*value)) {
      return;
    }
    iVar3 = utils::std::
            _Rb_tree<el::Level,_std::pair<const_el::Level,_unsigned_long>,_std::_Select1st<std::pair<const_el::Level,_unsigned_long>_>,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
            ::find(&confMap->_M_t,&local_2c);
    if ((_Rb_tree_header *)iVar3._M_node != p_Var1) {
      mVar2 = *value;
      pmVar4 = utils::std::
               map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
               ::at(confMap,&local_2c);
      *pmVar4 = mVar2;
      return;
    }
    local_28.second = *value;
    local_28.first = local_2c;
  }
  std::
  _Rb_tree<el::Level,std::pair<el::Level_const,unsigned_long>,std::_Select1st<std::pair<el::Level_const,unsigned_long>>,std::less<el::Level>,std::allocator<std::pair<el::Level_const,unsigned_long>>>
  ::_M_emplace_unique<std::pair<el::Level,unsigned_long>>
            ((_Rb_tree<el::Level,std::pair<el::Level_const,unsigned_long>,std::_Select1st<std::pair<el::Level_const,unsigned_long>>,std::less<el::Level>,std::allocator<std::pair<el::Level_const,unsigned_long>>>
              *)confMap,&local_28);
  return;
}

Assistant:

void setValue(Level level, const Conf_T& value, std::map<Level, Conf_T>* confMap, bool includeGlobalLevel = true) {
    // If map is empty and we are allowed to add into generic level (Level::Global), do it!
    if (confMap->empty() && includeGlobalLevel) {
      confMap->insert(std::make_pair(Level::Global, value));
      return;
    }
    // If same value exist in generic level already, dont add it to explicit level
    typename std::map<Level, Conf_T>::iterator it = confMap->find(Level::Global);
    if (it != confMap->end() && it->second == value) {
      return;
    }
    // Now make sure we dont double up values if we really need to add it to explicit level
    it = confMap->find(level);
    if (it == confMap->end()) {
      // Value not found for level, add new
      confMap->insert(std::make_pair(level, value));
    } else {
      // Value found, just update value
      confMap->at(level) = value;
    }
  }